

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::ComputePipeline::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  bindings;
  undefined1 local_a8 [24];
  VkAllocationCallbacks *pVStack_90;
  undefined1 local_88 [8];
  _Alloc_hider _Stack_80;
  pointer local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  pointer local_60;
  Parameters local_50;
  value_type local_34;
  
  local_a8._0_8_ = (pointer)(local_a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"comp","");
  local_88._0_4_ = VK_SHADER_STAGE_COMPUTE_BIT;
  _Stack_80._M_p = (pointer)&aStack_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_80,local_a8._0_8_,
             (undefined1 *)((long)(deUint32 *)local_a8._8_8_ + local_a8._0_8_));
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->shaderModule,env,(Parameters *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_80._M_p != &aStack_70) {
    operator_delete(_Stack_80._M_p,aStack_70._M_allocated_capacity + 1);
  }
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,(ulong)((long)(deUint32 *)local_a8._16_8_ + 1));
  }
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_34.binding = 0;
  local_34.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_34.descriptorCount = 1;
  local_34.stageFlags = 0x20;
  local_34.useImmutableSampler = false;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::push_back((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_a8,&local_34);
  local_34.binding = 1;
  local_34.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_34.descriptorCount = 1;
  local_34.stageFlags = 0x20;
  local_34.useImmutableSampler = false;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::push_back((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_a8,&local_34);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::vector(&local_50.bindings,
           (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
            *)local_a8);
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
  }
  PipelineLayout::Parameters::singleDescriptorSet((Parameters *)local_88,&local_50);
  Dependency<vkt::api::(anonymous_namespace)::PipelineLayout>::Dependency
            (&this->layout,env,(Parameters *)local_88);
  if ((void *)aStack_70._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)aStack_70._M_allocated_capacity,(long)local_60 - aStack_70._0_8_);
  }
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
             *)local_88);
  if (local_50.bindings.
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.bindings.
                    super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.bindings.
                          super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.bindings.
                          super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  _Stack_80._M_p = (pointer)0x0;
  local_78 = (pointer)0x0;
  aStack_70._M_allocated_capacity = 0;
  aStack_70._8_8_ = 0;
  local_88 = (undefined1  [8])0x11;
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)local_a8,env->vkd,env->device,
             (VkPipelineCacheCreateInfo *)local_88,env->allocationCallbacks);
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_device = (VkDevice)local_a8._16_8_;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_allocator = pVStack_90;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.
  m_internal = local_a8._0_8_;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_a8._8_8_;
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: shaderModule		(env, ShaderModule::Parameters(VK_SHADER_STAGE_COMPUTE_BIT, "comp"))
			, layout			(env, PipelineLayout::Parameters::singleDescriptorSet(getDescriptorSetLayout()))
			, pipelineCache		(env, PipelineCache::Parameters())
		{}